

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordCase::init(TessCoordCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  RenderTarget *renderTarget;
  ShaderProgram *pSVar4;
  RenderContext *renderCtx;
  Context *pCVar5;
  ProgramSources *pPVar6;
  TestLog *log;
  TestError *this_00;
  char *code;
  undefined1 in_R8B;
  TransformFeedbackMode local_340;
  allocator<char> local_339;
  string local_338;
  TransformFeedbackVarying local_318;
  string local_2f8;
  ShaderSource local_2d8;
  string local_2b0;
  ShaderSource local_290;
  string local_268;
  ShaderSource local_248;
  string local_220;
  ShaderSource local_200;
  ProgramSources local_1d8;
  SharedPtr<const_glu::ShaderProgram> local_108;
  allocator<char> local_f1;
  string local_f0 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string tessellationEvaluationTemplate;
  string local_68 [8];
  string tessellationControlTemplate;
  allocator<char> local_31;
  string local_30 [8];
  string vertexShaderTemplate;
  TessCoordCase *this_local;
  
  vertexShaderTemplate.field_2._8_8_ = this;
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"${GLSL_VERSION_DECL}\n\nvoid main (void)\n{\n}\n",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nuniform mediump float u_tessLevelInner0;\nuniform mediump float u_tessLevelInner1;\n\nuniform mediump float u_tessLevelOuter0;\nuniform mediump float u_tessLevelOuter1;\nuniform mediump float u_tessLevelOuter2;\nuniform mediump float u_tessLevelOuter3;\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = u_tessLevelInner0;\n\tgl_TessLevelInner[1] = u_tessLevelInner1;\n\n\tgl_TessLevelOuter[0] = u_tessLevelOuter0;\n\tgl_TessLevelOuter[1] = u_tessLevelOuter1;\n\tgl_TessLevelOuter[2] = u_tessLevelOuter2;\n\tgl_TessLevelOuter[3] = u_tessLevelOuter3;\n}\n"
             ,(allocator<char> *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xf));
  code = &DAT_00000001;
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)((long)&fragmentShaderTemplate.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)this->m_primitiveType,this->m_spacing,
             SPACINGMODE_FRACTIONAL_ODD,(bool)in_R8B);
  std::operator+(&local_b0,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragmentShaderTemplate.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_b0,
                 "\nout highp vec3 out_te_tessCoord;\n\nvoid main (void)\n{\n\tout_te_tessCoord = gl_TessCoord;\n\tgl_Position = vec4(gl_TessCoord.xy*1.6 - 0.8, 0.0, 1.0);\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n\to_color = vec4(1.0);\n}\n"
             ,&local_f1);
  std::allocator<char>::~allocator(&local_f1);
  pSVar4 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_1d8);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_220,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::VertexSource::VertexSource((VertexSource *)&local_200,&local_220);
  pPVar6 = glu::ProgramSources::operator<<(&local_1d8,&local_200);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_268,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_248,&local_268);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_248);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2b0,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_290,&local_2b0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_290);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f8,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_2d8,&local_2f8);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"out_te_tessCoord",&local_339);
  glu::TransformFeedbackVarying::TransformFeedbackVarying(&local_318,&local_338);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_318);
  glu::TransformFeedbackMode::TransformFeedbackMode(&local_340,0x8c8c);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_340);
  glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,pPVar6);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_108,pSVar4);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_108);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_108);
  glu::TransformFeedbackVarying::~TransformFeedbackVarying(&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  glu::VertexSource::~VertexSource((VertexSource *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  glu::ProgramSources::~ProgramSources(&local_1d8);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&this->m_program);
  glu::operator<<(log,pSVar4);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  bVar2 = glu::ShaderProgram::isOk(pSVar4);
  if (!bVar2) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x7af);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_68);
  iVar3 = std::__cxx11::string::~string(local_30);
  return iVar3;
}

Assistant:

void TessCoordCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
												 "}\n");

	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = 1) out;\n"
													 "\n"
													 "uniform mediump float u_tessLevelInner0;\n"
													 "uniform mediump float u_tessLevelInner1;\n"
													 "\n"
													 "uniform mediump float u_tessLevelOuter0;\n"
													 "uniform mediump float u_tessLevelOuter1;\n"
													 "uniform mediump float u_tessLevelOuter2;\n"
													 "uniform mediump float u_tessLevelOuter3;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	gl_TessLevelInner[0] = u_tessLevelInner0;\n"
													 "	gl_TessLevelInner[1] = u_tessLevelInner1;\n"
													 "\n"
													 "	gl_TessLevelOuter[0] = u_tessLevelOuter0;\n"
													 "	gl_TessLevelOuter[1] = u_tessLevelOuter1;\n"
													 "	gl_TessLevelOuter[2] = u_tessLevelOuter2;\n"
													 "	gl_TessLevelOuter[3] = u_tessLevelOuter3;\n"
												 "}\n");

	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, true) +
													 "\n"
													 "out highp vec3 out_te_tessCoord;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	out_te_tessCoord = gl_TessCoord;\n"
													 "	gl_Position = vec4(gl_TessCoord.xy*1.6 - 0.8, 0.0, 1.0);\n"
												 "}\n");

	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = vec4(1.0);\n"
												 "}\n");

       m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
			<< glu::TransformFeedbackVarying		("out_te_tessCoord")
			<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}